

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O0

void basiclu_obj_free(basiclu_object *obj)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    pvVar1 = lu_free((void *)0x85af1c);
    *in_RDI = pvVar1;
    pvVar1 = lu_free((void *)0x85af33);
    in_RDI[1] = pvVar1;
    pvVar1 = lu_free((void *)0x85af4b);
    in_RDI[2] = pvVar1;
    pvVar1 = lu_free((void *)0x85af63);
    in_RDI[5] = pvVar1;
    pvVar1 = lu_free((void *)0x85af7b);
    in_RDI[3] = pvVar1;
    pvVar1 = lu_free((void *)0x85af93);
    in_RDI[6] = pvVar1;
    pvVar1 = lu_free((void *)0x85afab);
    in_RDI[4] = pvVar1;
    pvVar1 = lu_free((void *)0x85afc3);
    in_RDI[7] = pvVar1;
    pvVar1 = lu_free((void *)0x85afdb);
    in_RDI[8] = pvVar1;
    pvVar1 = lu_free((void *)0x85aff3);
    in_RDI[9] = pvVar1;
    *(undefined4 *)(in_RDI + 10) = 0xffffffff;
  }
  return;
}

Assistant:

void basiclu_obj_free(struct basiclu_object *obj)
{
    if (obj)
    {
        obj->istore = lu_free(obj->istore);
        obj->xstore = lu_free(obj->xstore);
        obj->Li = lu_free(obj->Li);
        obj->Lx = lu_free(obj->Lx);
        obj->Ui = lu_free(obj->Ui);
        obj->Ux = lu_free(obj->Ux);
        obj->Wi = lu_free(obj->Wi);
        obj->Wx = lu_free(obj->Wx);
        obj->lhs = lu_free(obj->lhs);
        obj->ilhs = lu_free(obj->ilhs);
        obj->nzlhs = -1;
    }
}